

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O1

void KDReports::XmlParser::parseCommonTableAttributes
               (AbstractTableElement *tableElement,QDomElement *element)

{
  qreal border;
  char cVar1;
  int iVar2;
  QColor QVar3;
  QString widthStr;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QColor local_30;
  
  QVar3 = XmlHelper::readBackground(element);
  local_30._0_8_ = QVar3._0_8_;
  local_30.ct._4_4_ = QVar3.ct._4_4_;
  local_30.ct.argb.pad = QVar3.ct._8_2_;
  if (QVar3.cspec != Invalid) {
    QBrush::QBrush((QBrush *)&local_a0,&local_30,SolidPattern);
    Element::setBackground(&tableElement->super_Element,(QBrush *)&local_a0);
    QBrush::~QBrush((QBrush *)&local_a0);
  }
  local_a0.d = (Data *)0x0;
  local_a0.ptr = L"border";
  local_a0.size = 6;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  cVar1 = QDomElement::hasAttribute((QString *)element);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (cVar1 != '\0') {
    local_88.d = (Data *)0x0;
    local_88.ptr = L"border";
    local_88.size = 6;
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    QDomElement::attribute((QString *)&local_a0,(QString *)element);
    border = (qreal)QString::toDouble((bool *)&local_a0);
    AbstractTableElement::setBorder(tableElement,border);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  local_a0.d = (Data *)0x0;
  local_a0.ptr = L"width";
  local_a0.size = 5;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  cVar1 = QDomElement::hasAttribute((QString *)element);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (cVar1 != '\0') {
    local_88.d = (Data *)0x0;
    local_88.ptr = L"width";
    local_88.size = 5;
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    QDomElement::attribute((QString *)&local_a0,(QString *)element);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    cVar1 = QString::endsWith((QChar)(char16_t)&local_a0,0x25);
    if (cVar1 == '\0') {
      iVar2 = QString::toInt((QString *)&local_a0,(bool *)0x0,10);
    }
    else {
      QString::truncate((longlong)&local_a0);
      iVar2 = QString::toInt((QString *)&local_a0,(bool *)0x0,10);
    }
    AbstractTableElement::setWidth(tableElement,(double)iVar2,(uint)(cVar1 != '\0'));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  }
  return;
}

Assistant:

void KDReports::XmlParser::parseCommonTableAttributes(KDReports::AbstractTableElement &tableElement, QDomElement &element)
{
    const QColor bgColor = KDReports::XmlHelper::readBackground(element);
    if (bgColor.isValid())
        tableElement.setBackground(bgColor);
    if (element.hasAttribute(QStringLiteral("border")))
        tableElement.setBorder(element.attribute(QStringLiteral("border")).toDouble());
    if (element.hasAttribute(QStringLiteral("width"))) {
        QString widthStr = element.attribute(QStringLiteral("width"));
        if (widthStr.endsWith(QLatin1Char('%'))) {
            widthStr.truncate(widthStr.length() - 1);
            tableElement.setWidth(widthStr.toInt(), KDReports::Percent);
        } else {
            tableElement.setWidth(widthStr.toInt());
        }
    }
}